

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::numericalRoot<double>(double value,int power)

{
  double dVar1;
  int power_local;
  double value_local;
  
  switch(power) {
  case 0:
    value_local = 1.0;
    break;
  case 1:
    value_local = value;
    break;
  case 2:
    if (0.0 <= value) {
      value_local = sqrt(value);
    }
    else {
      value_local = NAN;
    }
    break;
  case 3:
    value_local = cbrt(value);
    break;
  case 4:
    if (0.0 <= value) {
      dVar1 = sqrt(value);
      value_local = sqrt(dVar1);
    }
    else {
      value_local = NAN;
    }
    break;
  case -4:
    if (0.0 <= value) {
      dVar1 = sqrt(1.0 / value);
      value_local = sqrt(dVar1);
    }
    else {
      value_local = NAN;
    }
    break;
  case -3:
    value_local = cbrt(1.0 / value);
    break;
  case -2:
    if (0.0 <= value) {
      value_local = sqrt(1.0 / value);
    }
    else {
      value_local = NAN;
    }
    break;
  case -1:
    value_local = 1.0 / value;
    break;
  default:
    if ((0.0 <= value) || (power % 2 != 0)) {
      value_local = pow(value,1.0 / (double)power);
    }
    else {
      value_local = NAN;
    }
  }
  return value_local;
}

Assistant:

X numericalRoot(X value, int power)
{
    switch (power) {
        case 0:
            return X{1.0};
        case 1:
            return value;
        case -1:
            return X{1.0} / value;
        case 2:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(value);
        case -2:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(X{1.0} / value);
        case 3:
            return std::cbrt(value);
        case -3:
            return std::cbrt(X{1.0} / value);
        case 4:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(std::sqrt(value));
        case -4:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(std::sqrt(X{1.0} / value));
        default:
            if (value < X{0.0} && power % 2 == 0) {
                return constants::invalid_conversion;
            }
            return std::pow(value, X{1.0} / static_cast<X>(power));
    }
}